

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O1

int do_call(void)

{
  uint uVar1;
  int iVar2;
  vm_register *pvVar3;
  int iVar4;
  undefined4 *puVar5;
  uint uVar6;
  uint uVar7;
  
  iVar4 = get_ins_len(code_ptr[registe_ptr->IP],code_ptr[registe_ptr->IP + 1]);
  pvVar3 = registe_ptr;
  uVar1 = registe_ptr->IP;
  uVar6 = registe_ptr->SP + 4;
  registe_ptr->SP = uVar6;
  if (code_ptr[uVar1 + 1] == '\x06') {
    iVar2 = *(int *)(code_ptr + (ulong)uVar1 + 2);
    *(uint *)(stack_ptr + uVar6) = iVar4 + uVar1;
    uVar7 = iVar2 + pvVar3->CS;
  }
  else {
    if (code_ptr[uVar1 + 1] != '\x05') {
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0xf6;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    uVar7 = *register_list[(byte)code_ptr[uVar1 + 2] >> 4];
    *(uint *)(stack_ptr + uVar6) = iVar4 + uVar1;
  }
  pvVar3->IP = uVar7;
  return 1;
}

Assistant:

int do_call() {
	int ins_len;
	ins_len = get_ins_len(code_ptr[registe_ptr->IP], code_ptr[registe_ptr->IP + 1]);
	registe_ptr->SP += 4;//栈指针增加
	if (code_ptr[registe_ptr->IP + 1] == 5) {//寄存器压栈
		uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
		unsigned num = *register_list[high];
		*(unsigned*)(stack_ptr + registe_ptr->SP) = registe_ptr->IP+ins_len;//返回地址压栈
		registe_ptr->IP = num;//修改
	}
	else if (code_ptr[registe_ptr->IP + 1] == 6) {//立即数压栈
		unsigned num = *(unsigned*)(code_ptr + registe_ptr->IP + 2);
		unsigned temp = registe_ptr->IP + ins_len;
		*(unsigned*)((unsigned char*)stack_ptr + registe_ptr->SP) = temp;
		registe_ptr->IP = num + registe_ptr->CS;//修改
	}
	else throw(LVM_EXECUTE_ERROR);
	
	return LVM_SUCCESS;
}